

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17898ce::BlendA64Mask1DTest8B_ExtremeValues_Test::TestBody
          (BlendA64Mask1DTest8B_ExtremeValues_Test *this)

{
  ACMRandom *this_00;
  uint32_t uVar1;
  int bsize;
  int block_size;
  long lVar2;
  
  this_00 = &(this->super_BlendA64Mask1DTest8B).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
             .rng_;
  for (lVar2 = 0x3c048; lVar2 != 0x50048; lVar2 = lVar2 + 1) {
    uVar1 = testing::internal::Random::Generate(&this_00->random_,2);
    *(char *)((long)this + lVar2 + -0x3c010) = (char)uVar1 + -2;
    uVar1 = testing::internal::Random::Generate(&this_00->random_,2);
    *(char *)((long)this + lVar2 + -0x28010) = (char)uVar1 + -2;
    uVar1 = testing::internal::Random::Generate(&this_00->random_,2);
    *(char *)((long)this + lVar2 + -0x14008) = (char)uVar1 + -2;
    uVar1 = testing::internal::Random::Generate(&this_00->random_,2);
    (this->super_BlendA64Mask1DTest8B).
    super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
    .dst_ref_[lVar2 + -0x38] = (char)uVar1 + 0xfe;
  }
  for (lVar2 = 0x50050; lVar2 != 0x50150; lVar2 = lVar2 + 1) {
    uVar1 = testing::internal::Random::Generate(&this_00->random_,2);
    (this->super_BlendA64Mask1DTest8B).
    super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
    .dst_ref_[lVar2 + -0x38] = (char)uVar1 + '?';
  }
  for (block_size = 0; block_size != 0x16; block_size = block_size + 1) {
    BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
    ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
              *)this,block_size);
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTest8B, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = rng_(2) + 254;
    dst_tst_[i] = rng_(2) + 254;
    src0_[i] = rng_(2) + 254;
    src1_[i] = rng_(2) + 254;
  }

  for (int i = 0; i < kMaxMaskSize; ++i)
    mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    Common(bsize);
  }
}